

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O1

Vec_Int_t * Wlc_NtkGetPut(Abc_Ntk_t *pNtk,Gia_Man_t *pGia)

{
  char cVar1;
  int Entry;
  long *plVar2;
  Abc_Obj_t *pObj;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p;
  int *piVar7;
  char *pcVar8;
  size_t sVar9;
  Vec_Int_t *p_00;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  bool bVar19;
  Abc_Nam_t *local_48;
  
  if (pNtk->vPos->nSize == 1) {
    if (pNtk->nObjCounts[7] == 1) {
      if (pNtk->vCos->nSize < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Entry = pGia->nRegs;
      plVar2 = (long *)*pNtk->vCos->pArray;
      plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      pcVar18 = (char *)plVar2[7];
      iVar5 = *(int *)((long)plVar2 + 0x1c);
      p = (Vec_Int_t *)malloc(0x10);
      iVar6 = 0x10;
      if (0xe < iVar5 - 1U) {
        iVar6 = iVar5;
      }
      p->nSize = 0;
      p->nCap = iVar6;
      if (iVar6 == 0) {
        piVar7 = (int *)0x0;
      }
      else {
        piVar7 = (int *)malloc((long)iVar6 << 2);
      }
      p->pArray = piVar7;
      uVar14 = 0;
      if (pGia->vNamesIn == (Vec_Ptr_t *)0x0) {
        local_48 = (Abc_Nam_t *)0x0;
      }
      else {
        local_48 = Abc_NamStart(100,0x10);
        uVar15 = 0;
        while ((long)uVar15 < (long)pGia->vNamesIn->nSize) {
          uVar3 = Abc_NamStrFindOrAdd(local_48,(char *)pGia->vNamesIn->pArray[uVar15],(int *)0x0);
          uVar15 = uVar15 + 1;
          if (uVar15 != uVar3) {
            __assert_fail("Value == i+1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                          ,0x106,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
          }
        }
      }
      if (0 < *(int *)((long)plVar2 + 0x1c)) {
        uVar15 = 0;
        uVar3 = 0;
        do {
          pObj = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                  (long)*(int *)(plVar2[4] + uVar15 * 4) * 8);
          uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
          if ((uVar4 != 2) && (uVar4 != 5)) {
            __assert_fail("Abc_ObjIsCi(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                          ,0x10d,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
          }
          pcVar8 = Abc_ObjName(pObj);
          if (local_48 == (Abc_Nam_t *)0x0) {
            sVar9 = strlen(pcVar8);
            uVar4 = (uint)sVar9;
            uVar16 = sVar9 & 0xffffffff;
            uVar10 = (int)uVar4 >> 0x1f & uVar4;
            uVar14 = sVar9 & 0xffffffff;
            do {
              uVar16 = uVar16 - 1;
              uVar12 = (uint)uVar14;
              uVar13 = uVar10 - 1;
              uVar11 = uVar10;
              if ((int)uVar12 < 1) break;
              uVar13 = uVar12 - 1;
              uVar14 = (ulong)uVar13;
              uVar11 = uVar12;
            } while (0xf5 < (byte)(pcVar8[uVar16 & 0xffffffff] - 0x3aU));
            if (uVar11 == uVar4) goto LAB_008a0610;
            iVar5 = atoi(pcVar8 + (long)(int)uVar13 + 1);
          }
          else {
            iVar5 = Abc_NamStrFind(local_48,pcVar8);
            iVar5 = ~pGia->vCis->nSize + iVar5 + pGia->nRegs;
            if (iVar5 < 0) {
LAB_008a0610:
              uVar4 = uVar3 + 1;
              bVar19 = uVar3 == 0;
              iVar5 = (int)uVar15;
              uVar3 = uVar4;
              if (bVar19) {
                printf("Cannot read input name \"%s\" of fanin %d.\n",pcVar8,uVar15 & 0xffffffff);
              }
            }
          }
          uVar14 = (ulong)uVar3;
          Vec_IntPush(p,iVar5);
          uVar15 = uVar15 + 1;
        } while ((long)uVar15 < (long)*(int *)((long)plVar2 + 0x1c));
      }
      if ((int)uVar14 != 0) {
        printf("Cannot read names for %d inputs of the invariant.\n",uVar14);
      }
      if (local_48 != (Abc_Nam_t *)0x0) {
        Abc_NamStop(local_48);
      }
      iVar5 = p->nSize;
      if (iVar5 != *(int *)((long)plVar2 + 0x1c)) {
        __assert_fail("Vec_IntSize(vFanins) == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                      ,0x12d,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
      }
      p_00 = (Vec_Int_t *)malloc(0x10);
      p_00->nCap = 1000;
      p_00->nSize = 0;
      piVar7 = (int *)malloc(4000);
      p_00->pArray = piVar7;
      iVar6 = Abc_SopGetCubeNum(pcVar18);
      Vec_IntPush(p_00,iVar6);
LAB_008a06ce:
      if (*pcVar18 == '\0') {
        Vec_IntPush(p_00,Entry);
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
        return p_00;
      }
      iVar6 = 0;
      pcVar8 = pcVar18;
      do {
        cVar1 = *pcVar8;
        if (cVar1 != '-') {
          if ((cVar1 == '\0') || (cVar1 == ' ')) goto LAB_008a06f1;
          iVar6 = iVar6 + 1;
        }
        pcVar8 = pcVar8 + 1;
      } while( true );
    }
    pcVar18 = "The number of internal nodes is other than 1.";
  }
  else {
    pcVar18 = "The number of outputs is other than 1.";
  }
  puts(pcVar18);
  return (Vec_Int_t *)0x0;
LAB_008a06f1:
  Vec_IntPush(p_00,iVar6);
  lVar17 = 0;
  do {
    cVar1 = pcVar18[lVar17];
    if (cVar1 != '-') {
      if ((cVar1 == '\0') || (cVar1 == ' ')) break;
      if (iVar5 <= lVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->pArray[lVar17] < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_00,(uint)(cVar1 == '0') + p->pArray[lVar17] * 2);
    }
    lVar17 = lVar17 + 1;
  } while( true );
  pcVar18 = pcVar18 + (long)*(int *)((long)plVar2 + 0x1c) + 3;
  goto LAB_008a06ce;
}

Assistant:

Vec_Int_t * Wlc_NtkGetPut( Abc_Ntk_t * pNtk, Gia_Man_t * pGia )
{
    int nRegs = Gia_ManRegNum(pGia);
    Vec_Int_t * vRes = NULL;
    if ( Abc_NtkPoNum(pNtk) != 1 )
        printf( "The number of outputs is other than 1.\n" );
    else if ( Abc_NtkNodeNum(pNtk) != 1 )
        printf( "The number of internal nodes is other than 1.\n" );
    else
    {
        Abc_Nam_t * pNames = NULL;
        Abc_Obj_t * pFanin, * pNode = Abc_ObjFanin0( Abc_NtkCo(pNtk, 0) );
        char * pName, * pCube, * pSop = (char *)pNode->pData;
        Vec_Int_t * vFanins = Vec_IntAlloc( Abc_ObjFaninNum(pNode) );
        int i, k, Value, nLits, Counter = 0;
        if ( pGia->vNamesIn )
        {
            // hash the names
            pNames = Abc_NamStart( 100, 16 );
            Vec_PtrForEachEntry( char *, pGia->vNamesIn, pName, i )
            {
                Value = Abc_NamStrFindOrAdd( pNames, pName, NULL );
                assert( Value == i+1 );
                //printf( "%s(%d) ", pName, i );
            }
            //printf( "\n" );
        }
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            assert( Abc_ObjIsCi(pFanin) );
            pName = Abc_ObjName(pFanin);
            if ( pNames )
            {
                Value = Abc_NamStrFind(pNames, pName) - 1 - Gia_ManPiNum(pGia);
                if ( Value < 0 )
                {
                    if ( Counter++ == 0 )
                        printf( "Cannot read input name \"%s\" of fanin %d.\n", pName, i );
                    Value = i;
                }
            }
            else
            {
                for ( k = (int)strlen(pName)-1; k >= 0; k-- )
                    if ( pName[k] < '0' || pName[k] > '9' )
                        break;
                if ( k == (int)strlen(pName)-1 )
                {
                    if ( Counter++ == 0 )
                        printf( "Cannot read input name \"%s\" of fanin %d.\n", pName, i );
                    Value = i;
                }
                else 
                    Value = atoi(pName + k + 1);
            }
            Vec_IntPush( vFanins, Value );
        }
        if ( Counter )
            printf( "Cannot read names for %d inputs of the invariant.\n", Counter );
        if ( pNames )
            Abc_NamStop( pNames );
        assert( Vec_IntSize(vFanins) == Abc_ObjFaninNum(pNode) );
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, Abc_SopGetCubeNum(pSop) );
        Abc_SopForEachCube( pSop, Abc_ObjFaninNum(pNode), pCube )
        {
            nLits = 0;
            Abc_CubeForEachVar( pCube, Value, k )
                if ( Value != '-' )
                    nLits++;
            Vec_IntPush( vRes, nLits );
            Abc_CubeForEachVar( pCube, Value, k )
                if ( Value != '-' )
                    Vec_IntPush( vRes, Abc_Var2Lit(Vec_IntEntry(vFanins, k), (int)Value == '0') );
        }
        Vec_IntPush( vRes, nRegs );
        Vec_IntFree( vFanins );
    }
    return vRes;
}